

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

void htmlSaveErr(int code,xmlNodePtr node,char *extra)

{
  int iVar1;
  char *pcStack_30;
  int res;
  char *msg;
  char *extra_local;
  xmlNodePtr node_local;
  int code_local;
  
  switch(code) {
  case 0x578:
    pcStack_30 = "string is not in UTF-8\n";
    break;
  case 0x579:
    pcStack_30 = "invalid character value\n";
    break;
  case 0x57a:
    pcStack_30 = "HTML has no DOCTYPE\n";
    break;
  case 0x57b:
    pcStack_30 = "unknown encoding %s\n";
    break;
  default:
    pcStack_30 = "unexpected error number\n";
  }
  iVar1 = xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,node,7,code,XML_ERR_ERROR,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,
                        pcStack_30,extra);
  if (iVar1 < 0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                        (xmlError *)0x0);
  }
  return;
}

Assistant:

static void
htmlSaveErr(int code, xmlNodePtr node, const char *extra)
{
    const char *msg = NULL;
    int res;

    switch(code) {
        case XML_SAVE_NOT_UTF8:
	    msg = "string is not in UTF-8\n";
	    break;
	case XML_SAVE_CHAR_INVALID:
	    msg = "invalid character value\n";
	    break;
	case XML_SAVE_UNKNOWN_ENCODING:
	    msg = "unknown encoding %s\n";
	    break;
	case XML_SAVE_NO_DOCTYPE:
	    msg = "HTML has no DOCTYPE\n";
	    break;
	default:
	    msg = "unexpected error number\n";
    }

    res = xmlRaiseError(NULL, NULL, NULL, NULL, node,
                        XML_FROM_OUTPUT, code, XML_ERR_ERROR, NULL, 0,
                        extra, NULL, NULL, 0, 0,
                        msg, extra);
    if (res < 0)
        xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_OUTPUT, NULL);
}